

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall crnlib::dxt_hc::determine_tiles_task_etc(dxt_hc *this,uint64 data,void *param_2)

{
  float fVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint pixels_count;
  color_quad<unsigned_char,_int> *pixels;
  uchar *puVar6;
  uint *puVar7;
  endpoint_indices_details *peVar8;
  double dVar9;
  uchar local_388;
  float local_348 [2];
  color_quad<unsigned_char,_int> *local_320;
  uint local_318;
  uint bx;
  uint local_2fc;
  tile_details *ptStack_2f8;
  uint t_2;
  tile_details *tile;
  uint s_1;
  uint tile_index;
  vec2F alpha_endpoints;
  double peakSNR;
  float local_2d0;
  float quality;
  uint e_1;
  uint best_encoding;
  float best_quality;
  uint8 s;
  uint8 t_1;
  float fStack_2bc;
  uint8 e;
  uint t;
  uint p;
  uint bEnd;
  uint b;
  float weight;
  uint level;
  int refine [4];
  float fStack_290;
  int scan [3];
  results results;
  undefined1 local_250 [8];
  params params;
  etc1_optimizer optimizer;
  uint total_error [3];
  uint tile_error [5];
  uint8 selectors [32];
  color_quad_u8 tilePixels [32];
  uint8 auStack_3e [2];
  uint8 tile_map [3] [2];
  uint8 tiles [3] [2];
  uint offsets [5];
  uint num_tasks;
  void *param_2_local;
  uint64 data_local;
  dxt_hc *this_local;
  
  uVar5 = task_pool::get_num_threads(this->m_pTask_pool);
  stack0xffffffffffffffc8 = 0.0;
  tiles._2_4_ = 1.12104e-44;
  tile_map[1][0] = '\0';
  tile_map[1][1] = '\x01';
  tilePixels[0x1f].field_0 =
       (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
       (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0)
       0x1000000;
  local_320 = (color_quad<unsigned_char,_int> *)(selectors + 0x18);
  do {
    color_quad<unsigned_char,_int>::color_quad(local_320);
    local_320 = local_320 + 1;
  } while (local_320 != tilePixels + 0x1e);
  etc1_optimizer::etc1_optimizer((etc1_optimizer *)&params.m_constrain_against_base_color5);
  etc1_optimizer::params::params((params *)local_250);
  params.m_pSrc_pixels._0_1_ = 0;
  params.m_scan_delta_size._0_1_ = 0;
  etc1_optimizer::results::results((results *)(scan + 1));
  refine[3] = -1;
  fStack_290 = 0.0;
  scan[0] = 1;
  weight = -NAN;
  level = 0xfffffffe;
  refine[0] = 2;
  refine[1] = 3;
  for (b = 0; b < (this->m_params).m_num_levels; b = b + 1) {
    fVar1 = (this->m_params).m_levels[b].m_weight;
    uVar3 = (this->m_params).m_levels[b].m_first_block;
    uVar4 = (this->m_params).m_levels[b].m_num_blocks;
    for (p = (this->m_params).m_levels[b].m_first_block +
             (int)(((this->m_params).m_levels[b].m_num_blocks * data) / (ulong)(uVar5 + 1)) &
             0xfffffffe;
        p < (uVar3 + (int)(((ulong)uVar4 * (data + 1)) / (ulong)(uVar5 + 1)) & 0xfffffffe);
        p = p + 2) {
      for (fStack_2bc = 0.0; (uint)fStack_2bc < 0x10; fStack_2bc = (float)((int)fStack_2bc + 1)) {
        color_quad<unsigned_char,_int>::operator=
                  (tilePixels + ((ulong)(uint)fStack_2bc - 2),
                   this->m_blocks[p >> 1] + (((uint)fStack_2bc & 3) << 2 | (uint)fStack_2bc >> 2));
      }
      memcpy(tilePixels + 0xe,this->m_blocks + (p >> 1),0x40);
      for (best_quality = 0.0; (uint)best_quality < 5; best_quality = (float)((int)best_quality + 1)
          ) {
        params._8_8_ = tilePixels +
                       ((ulong)*(uint *)(tiles + (ulong)(uint)best_quality * 2 + -1) - 2);
        params.super_crn_etc1_pack_params.m_quality = 8 << ((byte)((uint)best_quality >> 2) & 0x1f);
        etc1_optimizer::init
                  ((etc1_optimizer *)&params.m_constrain_against_base_color5,
                   (EVP_PKEY_CTX *)local_250);
        params._24_8_ = refine + 3;
        params.m_pScan_deltas._0_4_ = 3;
        etc1_optimizer::compute((etc1_optimizer *)&params.m_constrain_against_base_color5);
        if ((ulong)(params.super_crn_etc1_pack_params.m_quality * 0x177) < (ulong)scan._4_8_) {
          params._24_8_ = &weight;
          params.m_pScan_deltas._0_4_ = 4;
          etc1_optimizer::compute((etc1_optimizer *)&params.m_constrain_against_base_color5);
        }
        total_error[(ulong)(uint)best_quality + 1] = (uint)scan._4_8_;
      }
      for (best_encoding._3_1_ = 0; best_encoding._3_1_ < 3;
          best_encoding._3_1_ = best_encoding._3_1_ + 1) {
        (&optimizer.m_temp_selectors.m_capacity)[best_encoding._3_1_] = 0;
        best_encoding._2_1_ = 0;
        for (best_encoding._1_1_ = best_encoding._3_1_ + 1; best_encoding._1_1_ != 0;
            best_encoding._1_1_ = (byte)((int)(uint)best_encoding._1_1_ >> 1)) {
          (&optimizer.m_temp_selectors.m_capacity)[best_encoding._3_1_] =
               total_error[(ulong)tile_map[(ulong)best_encoding._3_1_ - 1][best_encoding._2_1_] + 1]
               + (&optimizer.m_temp_selectors.m_capacity)[best_encoding._3_1_];
          best_encoding._2_1_ = best_encoding._2_1_ + 1;
        }
      }
      e_1 = 0;
      quality = 0.0;
      for (local_2d0 = 0.0; (uint)local_2d0 < 3; local_2d0 = (float)((int)local_2d0 + 1)) {
        if ((&optimizer.m_temp_selectors.m_capacity)[(uint)local_2d0] == 0) {
          local_348[0] = 0.0;
          local_348[1] = 10.907347;
        }
        else {
          dVar9 = sqrt((double)(&optimizer.m_temp_selectors.m_capacity)[(uint)local_2d0] / 48.0);
          dVar9 = log10(255.0 / dVar9);
          local_348 = (float  [2])(dVar9 * 20.0);
        }
        alpha_endpoints.m_s[0] = local_348[0];
        alpha_endpoints.m_s[1] = local_348[1];
        dVar9 = math::maximum<double>
                          ((double)local_348 - (double)this->m_color_derating[b][(uint)local_2d0],
                           0.0);
        if ((float)e_1 < (float)dVar9) {
          quality = local_2d0;
          e_1 = (uint)(float)dVar9;
        }
      }
      if (this->m_num_alpha_blocks == 0) {
        vec<2U,_float>::vec((vec<2U,_float> *)&s_1,cClear);
      }
      else {
        palettize_alpha((dxt_hc *)&s_1,(color_quad_u8 *)this,(int)selectors + 0x18,0x10);
      }
      tile._4_4_ = 0;
      for (tile._0_4_ = (int)quality + 1; (uint)tile != 0; tile._0_4_ = (uint)tile >> 1) {
        ptStack_2f8 = vector<crnlib::dxt_hc::tile_details>::operator[]
                                (&this->m_tiles,p | tile._4_4_);
        local_2fc = (uint)tile_map[(ulong)(uint)quality - 1][tile._4_4_];
        vector<crnlib::color_quad<unsigned_char,_int>_>::append
                  (&ptStack_2f8->pixels,
                   tilePixels + ((ulong)*(uint *)(tiles + (ulong)local_2fc * 2 + -1) - 2),
                   8 << (tile_map[(ulong)(uint)quality - 1][tile._4_4_] >> 2 & 0x1f));
        ptStack_2f8->weight = fVar1;
        pixels = vector<crnlib::color_quad<unsigned_char,_int>_>::get_ptr(&ptStack_2f8->pixels);
        pixels_count = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&ptStack_2f8->pixels);
        palettize_color((vec6F *)&stack0xfffffffffffffcec,this,pixels,pixels_count);
        vec<6U,_float>::operator=
                  (&ptStack_2f8->color_endpoint,(vec<6U,_float> *)&stack0xfffffffffffffcec);
        if (this->m_num_alpha_blocks != 0) {
          vec<2U,_float>::operator=(ptStack_2f8->alpha_endpoints,(vec<2U,_float> *)&s_1);
        }
        tile._4_4_ = tile._4_4_ + 1;
      }
      for (local_318 = 0; local_318 < 2; local_318 = local_318 + 1) {
        puVar6 = vector<unsigned_char>::operator[](&this->m_block_encodings,p | local_318);
        *puVar6 = quality._0_1_;
        bVar2 = tilePixels[0x1f].field_0.c[(ulong)local_318 + (ulong)(uint)quality * 2];
        puVar7 = vector<unsigned_int>::operator[](&this->m_tile_indices,p | local_318);
        *puVar7 = p | bVar2;
        local_388 = quality._0_1_;
        if (local_318 == 0) {
          local_388 = '\0';
        }
        peVar8 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                           (&this->m_endpoint_indices,p | local_318);
        peVar8->reference = local_388;
      }
      if ((uint)quality >> 1 != 0) {
        memcpy(this->m_blocks + (p >> 1),selectors + 0x18,0x40);
      }
    }
  }
  etc1_optimizer::~etc1_optimizer((etc1_optimizer *)&params.m_constrain_against_base_color5);
  return;
}

Assistant:

void dxt_hc::determine_tiles_task_etc(uint64 data, void*)
    {
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        uint offsets[5] = { 0, 8, 16, 24, 16 };
        uint8 tiles[3][2] = { { 4 }, { 2, 3 }, { 0, 1 } };
        uint8 tile_map[3][2] = { { 0, 0 }, { 0, 1 }, { 0, 1 } };
        color_quad_u8 tilePixels[32];
        uint8 selectors[32];
        uint tile_error[5];
        uint total_error[3];

        etc1_optimizer optimizer;
        etc1_optimizer::params params;
        params.m_use_color4 = false;
        params.m_constrain_against_base_color5 = false;
        etc1_optimizer::results results;
        results.m_pSelectors = selectors;
        int scan[] = { -1, 0, 1 };
        int refine[] = { -3, -2, 2, 3 };

        for (uint level = 0; level < m_params.m_num_levels; level++)
        {
            float weight = m_params.m_levels[level].m_weight;
            uint b = (m_params.m_levels[level].m_first_block + m_params.m_levels[level].m_num_blocks * data / num_tasks) & ~1;
            uint bEnd = (m_params.m_levels[level].m_first_block + m_params.m_levels[level].m_num_blocks * (data + 1) / num_tasks) & ~1;
            for (; b < bEnd; b += 2)
            {
                for (uint p = 0; p < 16; p++)
                {
                    tilePixels[p] = m_blocks[b >> 1][(p << 2 & 12) | p >> 2];
                }
                memcpy(tilePixels + 16, m_blocks[b >> 1], 64);
                for (uint t = 0; t < 5; t++)
                {
                    params.m_pSrc_pixels = tilePixels + offsets[t];
                    params.m_num_src_pixels = results.m_n = 8 << (t >> 2);
                    optimizer.init(params, results);
                    params.m_pScan_deltas = scan;
                    params.m_scan_delta_size = sizeof(scan) / sizeof(*scan);
                    optimizer.compute();
                    if (results.m_error > 375 * params.m_num_src_pixels)
                    {
                        params.m_pScan_deltas = refine;
                        params.m_scan_delta_size = sizeof(refine) / sizeof(*refine);
                        optimizer.compute();
                    }
                    tile_error[t] = results.m_error;
                }

                for (uint8 e = 0; e < 3; e++)
                {
                    total_error[e] = 0;
                    for (uint8 t = 0, s = e + 1; s; s >>= 1, t++)
                    {
                        total_error[e] += tile_error[tiles[e][t]];
                    }
                }

                float best_quality = 0.0f;
                uint best_encoding = 0;
                for (uint e = 0; e < 3; e++)
                {
                    float quality = 0;
                    double peakSNR = total_error[e] ? log10(255.0f / sqrt(total_error[e] / 48.0)) * 20.0f : 999999.0f;
                    quality = (float)math::maximum<double>(peakSNR - m_color_derating[level][e], 0.0f);
                    if (quality > best_quality)
                    {
                        best_quality = quality;
                        best_encoding = e;
                    }
                }

                vec2F alpha_endpoints = m_num_alpha_blocks ? palettize_alpha(tilePixels, 16, 3) : vec2F(cClear);
                for (uint tile_index = 0, s = best_encoding + 1; s; s >>= 1, tile_index++)
                {
                    tile_details& tile = m_tiles[b | tile_index];
                    uint t = tiles[best_encoding][tile_index];
                    tile.pixels.append(tilePixels + offsets[t], 8 << (t >> 2));
                    tile.weight = weight;
                    tile.color_endpoint = palettize_color(tile.pixels.get_ptr(), tile.pixels.size());
                    if (m_num_alpha_blocks)
                    {
                        tile.alpha_endpoints[0] = alpha_endpoints;
                    }
                }

                for (uint bx = 0; bx < 2; bx++)
                {
                    m_block_encodings[b | bx] = best_encoding;
                    m_tile_indices[b | bx] = b | tile_map[best_encoding][bx];
                    m_endpoint_indices[b | bx].reference = bx ? best_encoding : 0;
                }
                if (best_encoding >> 1)
                {
                    memcpy(m_blocks[b >> 1], tilePixels, 64);
                }
            }
        }
    }